

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabFilterMethod
              (sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nUnused,
              sqlite3_value **apVal)

{
  int iVar1;
  int iVar2;
  sqlite3_vtab *psVar3;
  bool bVar4;
  Fts5Index *pIndex;
  char *zCopy;
  sqlite3_value *pLe;
  sqlite3_value *pGe;
  sqlite3_value *pEq;
  uchar *puStack_58;
  int nTerm;
  char *zTerm;
  int f;
  int iVal;
  int rc;
  int eType;
  Fts5VocabCursor *pCsr;
  Fts5VocabTable *pTab;
  sqlite3_value **apVal_local;
  int nUnused_local;
  char *zUnused_local;
  int idxNum_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  iVar1 = pCursor->pVtab[2].nRef;
  f = 0;
  zTerm._0_4_ = 8;
  puStack_58 = (uchar *)0x0;
  pEq._4_4_ = 0;
  pGe = (sqlite3_value *)0x0;
  pLe = (sqlite3_value *)0x0;
  zCopy = (char *)0x0;
  fts5VocabResetCursor((Fts5VocabCursor *)pCursor);
  bVar4 = (idxNum & 1U) != 0;
  if (bVar4) {
    pGe = *apVal;
  }
  zTerm._4_4_ = (uint)bVar4;
  if ((idxNum & 2U) != 0) {
    pLe = apVal[(int)zTerm._4_4_];
    zTerm._4_4_ = zTerm._4_4_ + 1;
  }
  if ((idxNum & 4U) != 0) {
    zCopy = (char *)apVal[(int)zTerm._4_4_];
  }
  if (pGe == (sqlite3_value *)0x0) {
    if (pLe != (sqlite3_value *)0x0) {
      puStack_58 = sqlite3_value_text(pLe);
      pEq._4_4_ = sqlite3_value_bytes(pLe);
    }
    if (zCopy != (char *)0x0) {
      pIndex = (Fts5Index *)sqlite3_value_text((sqlite3_value *)zCopy);
      if (pIndex == (Fts5Index *)0x0) {
        pIndex = (Fts5Index *)0x22fef2;
      }
      iVar2 = sqlite3_value_bytes((sqlite3_value *)zCopy);
      *(int *)&pCursor[5].pVtab = iVar2;
      psVar3 = (sqlite3_vtab *)sqlite3_malloc(*(int *)&pCursor[5].pVtab + 1);
      pCursor[6].pVtab = psVar3;
      if (pCursor[6].pVtab == (sqlite3_vtab *)0x0) {
        f = 7;
      }
      else {
        memcpy(pCursor[6].pVtab,pIndex,(long)(*(int *)&pCursor[5].pVtab + 1));
      }
    }
  }
  else {
    puStack_58 = sqlite3_value_text(pGe);
    pEq._4_4_ = sqlite3_value_bytes(pGe);
    zTerm._0_4_ = 0;
  }
  if (f == 0) {
    f = sqlite3Fts5IndexQuery
                  (*(Fts5Index **)&pCursor[2].pVtab[1].nRef,(char *)puStack_58,pEq._4_4_,(int)zTerm,
                   (Fts5Colset *)0x0,(Fts5IndexIter **)(pCursor + 4));
  }
  if ((f == 0) && (iVar1 == 2)) {
    f = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
  }
  if (((f == 0) && (*(int *)&pCursor[3].pVtab == 0)) &&
     ((iVar1 != 2 || (*(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4) != 1)))) {
    f = fts5VocabNextMethod(pCursor);
  }
  return f;
}

Assistant:

static int fts5VocabFilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nUnused,                    /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  int eType = pTab->eType;
  int rc = SQLITE_OK;

  int iVal = 0;
  int f = FTS5INDEX_QUERY_SCAN;
  const char *zTerm = 0;
  int nTerm = 0;

  sqlite3_value *pEq = 0;
  sqlite3_value *pGe = 0;
  sqlite3_value *pLe = 0;

  UNUSED_PARAM2(zUnused, nUnused);

  fts5VocabResetCursor(pCsr);
  if( idxNum & FTS5_VOCAB_TERM_EQ ) pEq = apVal[iVal++];
  if( idxNum & FTS5_VOCAB_TERM_GE ) pGe = apVal[iVal++];
  if( idxNum & FTS5_VOCAB_TERM_LE ) pLe = apVal[iVal++];

  if( pEq ){
    zTerm = (const char *)sqlite3_value_text(pEq);
    nTerm = sqlite3_value_bytes(pEq);
    f = 0;
  }else{
    if( pGe ){
      zTerm = (const char *)sqlite3_value_text(pGe);
      nTerm = sqlite3_value_bytes(pGe);
    }
    if( pLe ){
      const char *zCopy = (const char *)sqlite3_value_text(pLe);
      if( zCopy==0 ) zCopy = "";
      pCsr->nLeTerm = sqlite3_value_bytes(pLe);
      pCsr->zLeTerm = sqlite3_malloc(pCsr->nLeTerm+1);
      if( pCsr->zLeTerm==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memcpy(pCsr->zLeTerm, zCopy, pCsr->nLeTerm+1);
      }
    }
  }

  if( rc==SQLITE_OK ){
    Fts5Index *pIndex = pCsr->pFts5->pIndex;
    rc = sqlite3Fts5IndexQuery(pIndex, zTerm, nTerm, f, 0, &pCsr->pIter);
  }
  if( rc==SQLITE_OK && eType==FTS5_VOCAB_INSTANCE ){
    rc = fts5VocabInstanceNewTerm(pCsr);
  }
  if( rc==SQLITE_OK && !pCsr->bEof 
   && (eType!=FTS5_VOCAB_INSTANCE 
    || pCsr->pFts5->pConfig->eDetail!=FTS5_DETAIL_NONE)
  ){
    rc = fts5VocabNextMethod(pCursor);
  }

  return rc;
}